

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_face.c
# Opt level: O3

REF_STATUS ref_face_spanning(REF_FACE ref_face,REF_INT node0,REF_INT node1,REF_INT *face)

{
  int iVar1;
  REF_ADJ pRVar2;
  REF_INT *pRVar3;
  REF_ADJ_ITEM pRVar4;
  REF_STATUS RVar5;
  long lVar6;
  uint uVar7;
  
  *face = -1;
  RVar5 = 5;
  if (((-1 < node0) && (pRVar2 = ref_face->adj, RVar5 = 5, node0 < pRVar2->nnode)) &&
     (lVar6 = (long)pRVar2->first[(uint)node0], lVar6 != -1)) {
    pRVar4 = pRVar2->item + lVar6;
    pRVar3 = ref_face->f2n;
    while( true ) {
      iVar1 = pRVar4->ref;
      uVar7 = iVar1 * 4;
      if ((((pRVar3[(long)iVar1 * 4] == node0) || (pRVar3[(int)(uVar7 | 1)] == node0)) ||
          ((pRVar3[(int)(uVar7 | 2)] == node0 || (pRVar3[(int)(uVar7 | 3)] == node0)))) &&
         (((pRVar3[(long)iVar1 * 4] == node1 || (pRVar3[(int)(uVar7 | 1)] == node1)) ||
          ((pRVar3[(int)(uVar7 | 2)] == node1 || (pRVar3[(int)(uVar7 | 3)] == node1)))))) break;
      pRVar4 = ref_face->adj->item;
      lVar6 = (long)pRVar4[(int)lVar6].next;
      if (lVar6 == -1) {
        return 5;
      }
      pRVar4 = pRVar4 + lVar6;
    }
    *face = iVar1;
    RVar5 = 0;
  }
  return RVar5;
}

Assistant:

REF_FCN REF_STATUS ref_face_spanning(REF_FACE ref_face, REF_INT node0,
                                     REF_INT node1, REF_INT *face) {
  REF_INT item, ref;

  (*face) = REF_EMPTY;

  each_ref_adj_node_item_with_ref(ref_face_adj(ref_face), node0, item, ref) {
    if ((node0 == ref_face_f2n(ref_face, 0, ref) ||
         node0 == ref_face_f2n(ref_face, 1, ref) ||
         node0 == ref_face_f2n(ref_face, 2, ref) ||
         node0 == ref_face_f2n(ref_face, 3, ref)) &&
        (node1 == ref_face_f2n(ref_face, 0, ref) ||
         node1 == ref_face_f2n(ref_face, 1, ref) ||
         node1 == ref_face_f2n(ref_face, 2, ref) ||
         node1 == ref_face_f2n(ref_face, 3, ref))) {
      (*face) = ref;
      return REF_SUCCESS;
    }
  }

  return REF_NOT_FOUND;
}